

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

void update_firstpass_stats
               (AV1_COMP *cpi,FRAME_STATS *stats,double raw_err_stdev,int frame_number,
               int64_t ts_duration,BLOCK_SIZE fp_block_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  FIRSTPASS_STATS *pFVar7;
  aom_codec_pkt_list *list;
  STATS_BUFFER_CTX *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int *piVar14;
  int iVar15;
  undefined3 in_register_00000081;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double local_208;
  double dStack_1f0;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  double local_190;
  double local_188;
  undefined1 local_180 [16];
  double local_170;
  double local_168;
  double local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  undefined1 local_100 [16];
  double local_f0;
  double local_e8;
  double local_e0;
  aom_codec_cx_pkt local_d8;
  
  uVar16 = CONCAT31(in_register_00000081,fp_block_size);
  pAVar6 = cpi->ppi;
  piVar14 = &cpi->initial_mbs;
  if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
    piVar14 = &(cpi->common).mi_params.MBs;
  }
  iVar5 = *piVar14;
  if ((0x28ff00UL >> ((ulong)uVar16 & 0x3f) & 1) == 0) {
    iVar15 = iVar5 << (4 - (""[uVar16] + ""[uVar16]) & 0x1f);
  }
  else {
    iVar15 = iVar5 >> ((""[uVar16] + ""[uVar16]) - 4 & 0x1f);
  }
  dVar26 = (double)iVar15;
  pFVar7 = ((pAVar6->twopass).stats_buf_ctx)->stats_in_end;
  if (dVar26 < 0.0) {
    dVar20 = sqrt(dVar26);
  }
  else {
    dVar20 = SQRT(dVar26);
  }
  local_128 = 0.0;
  dVar20 = dVar20 * 200.0;
  local_1c0._8_8_ = stats->intra_factor * stats->brightness_factor;
  local_1c0._0_8_ = (undefined8)frame_number;
  uVar3 = stats->coded_error;
  uVar4 = stats->sr_coded_error;
  auVar28._0_8_ = dVar20 + (double)CONCAT44((int)((long)uVar3 >> 0x28),(int)((ulong)uVar3 >> 8));
  auVar28._8_8_ = dVar20 + (double)CONCAT44((int)((long)uVar4 >> 0x28),(int)((ulong)uVar4 >> 8));
  auVar27._0_8_ = (double)(stats->intra_error >> 8) + dVar20;
  local_110 = 1.0;
  local_190 = (double)stats->inter_count / dVar26;
  auVar30._0_8_ = (double)stats->second_ref_count;
  auVar30._8_8_ = stats->neutral_count;
  auVar22._8_8_ = dVar26;
  auVar22._0_8_ = dVar26;
  local_180 = divpd(auVar30,auVar22);
  local_170 = (double)stats->intra_skip_count / dVar26;
  local_168 = (double)stats->image_data_start_row;
  local_160 = 0.0;
  local_100 = ZEXT816(0);
  local_f0 = 1.0;
  iVar15 = stats->mv_count;
  dVar20 = 0.0;
  local_188 = 0.0;
  auVar32 = ZEXT816(0);
  auVar22 = ZEXT816(0);
  auVar30 = local_100;
  if (0 < iVar15) {
    local_188 = (double)iVar15;
    dVar20 = (double)stats->sum_mvr;
    uVar23 = SUB84(local_188,0);
    uVar24 = (undefined4)((ulong)local_188 >> 0x20);
    auVar29._8_8_ = (double)stats->sum_mvr_abs;
    auVar29._0_8_ = dVar20;
    auVar32._8_4_ = uVar23;
    auVar32._0_8_ = local_188;
    auVar32._12_4_ = uVar24;
    auVar30 = divpd(auVar29,auVar32);
    auVar31._0_8_ = (double)stats->sum_mvc;
    auVar31._8_8_ = (double)stats->sum_mvc_abs;
    auVar11._8_4_ = uVar23;
    auVar11._0_8_ = local_188;
    auVar11._12_4_ = uVar24;
    auVar32 = divpd(auVar31,auVar11);
    auVar21._0_8_ = dVar20 * dVar20;
    auVar21._8_8_ = auVar31._0_8_ * auVar31._0_8_;
    auVar12._8_4_ = uVar23;
    auVar12._0_8_ = local_188;
    auVar12._12_4_ = uVar24;
    auVar22 = divpd(auVar21,auVar12);
    auVar25._0_8_ = (double)stats->sum_mvrs - auVar22._0_8_;
    auVar25._8_8_ = (double)stats->sum_mvcs - auVar22._8_8_;
    auVar13._8_4_ = uVar23;
    auVar13._0_8_ = local_188;
    auVar13._12_4_ = uVar24;
    auVar22 = divpd(auVar25,auVar13);
    local_128 = (double)stats->sum_in_vectors / (double)(iVar15 * 2);
    dVar20 = (double)stats->new_mv_count;
    local_188 = local_188 / dVar26;
  }
  local_118 = (double)ts_duration;
  auVar19._0_8_ = (double)iVar5;
  auVar19._8_8_ = auVar19._0_8_;
  local_1a0 = divpd(auVar28,auVar19);
  auVar27._8_8_ = (double)stats->frame_avg_wavelet_energy;
  auVar28 = divpd(auVar27,auVar19);
  uVar1 = (cpi->common).width;
  uVar2 = (cpi->common).height;
  dVar26 = (double)(int)uVar1;
  auVar9._8_4_ = SUB84((double)(int)uVar2,0);
  auVar9._0_8_ = dVar26;
  auVar9._12_4_ = (int)((ulong)(double)(int)uVar2 >> 0x20);
  local_1c0._16_16_ = auVar28;
  local_108 = raw_err_stdev;
  local_e0 = log1p(local_1a0._0_8_);
  local_208 = auVar28._0_8_;
  local_e8 = log1p(local_208);
  dStack_1f0 = auVar9._8_8_;
  auVar17._8_8_ = dStack_1f0;
  auVar17._0_8_ = dStack_1f0;
  local_158 = divpd(auVar30,auVar17);
  auVar18._8_8_ = dVar26;
  auVar18._0_8_ = dVar26;
  local_148 = divpd(auVar32,auVar18);
  auVar10._8_4_ = SUB84(dVar26 * dVar26,0);
  auVar10._0_8_ = dStack_1f0 * dStack_1f0;
  auVar10._12_4_ = (int)((ulong)(dVar26 * dVar26) >> 0x20);
  local_138 = divpd(auVar22,auVar10);
  local_120 = dVar20 / auVar19._0_8_;
  memcpy(pFVar7,local_1c0,0xe8);
  if (cpi->ppi->lap_enabled == 0) {
    list = cpi->ppi->output_pkt_list;
    local_d8.kind = AOM_CODEC_STATS_PKT;
    local_d8.data.frame.sz = 0xe8;
    local_d8.data.frame.buf = pFVar7;
    if (list != (aom_codec_pkt_list *)0x0) {
      aom_codec_pkt_list_add(list,&local_d8);
    }
  }
  else {
    av1_firstpass_info_push(&(pAVar6->twopass).firstpass_info,pFVar7);
  }
  pFVar7 = ((cpi->ppi->twopass).stats_buf_ctx)->total_stats;
  if (pFVar7 != (FIRSTPASS_STATS *)0x0) {
    av1_accumulate_stats(pFVar7,(FIRSTPASS_STATS *)local_1c0);
  }
  pSVar8 = (pAVar6->twopass).stats_buf_ctx;
  pFVar7 = pSVar8->stats_in_end;
  pSVar8->stats_in_end = pFVar7 + 1;
  if (((cpi->use_ducky_encode == 0) && ((cpi->oxcf).pass == AOM_RC_FIRST_PASS)) &&
     (pSVar8->stats_in_buf_end <= pFVar7 + 1)) {
    pSVar8->stats_in_end = pSVar8->stats_in_start;
  }
  return;
}

Assistant:

static void update_firstpass_stats(AV1_COMP *cpi,
                                   const FRAME_STATS *const stats,
                                   const double raw_err_stdev,
                                   const int frame_number,
                                   const int64_t ts_duration,
                                   const BLOCK_SIZE fp_block_size) {
  TWO_PASS *twopass = &cpi->ppi->twopass;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  FIRSTPASS_STATS *this_frame_stats = twopass->stats_buf_ctx->stats_in_end;
  FIRSTPASS_STATS fps;
  // The minimum error here insures some bit allocation to frames even
  // in static regions. The allocation per MB declines for larger formats
  // where the typical "real" energy per MB also falls.
  // Initial estimate here uses sqrt(mbs) to define the min_err, where the
  // number of mbs is proportional to the image area.
  const int num_mbs_16X16 = (cpi->oxcf.resize_cfg.resize_mode != RESIZE_NONE)
                                ? cpi->initial_mbs
                                : mi_params->MBs;
  // Number of actual units used in the first pass, it can be other square
  // block sizes than 16X16.
  const int num_mbs = get_num_mbs(fp_block_size, num_mbs_16X16);
  const double min_err = 200 * sqrt(num_mbs);

  fps.weight = stats->intra_factor * stats->brightness_factor;
  fps.frame = frame_number;
  fps.coded_error = (double)(stats->coded_error >> 8) + min_err;
  fps.sr_coded_error = (double)(stats->sr_coded_error >> 8) + min_err;
  fps.intra_error = (double)(stats->intra_error >> 8) + min_err;
  fps.frame_avg_wavelet_energy = (double)stats->frame_avg_wavelet_energy;
  fps.count = 1.0;
  fps.pcnt_inter = (double)stats->inter_count / num_mbs;
  fps.pcnt_second_ref = (double)stats->second_ref_count / num_mbs;
  fps.pcnt_neutral = (double)stats->neutral_count / num_mbs;
  fps.intra_skip_pct = (double)stats->intra_skip_count / num_mbs;
  fps.inactive_zone_rows = (double)stats->image_data_start_row;
  fps.inactive_zone_cols = 0.0;  // Placeholder: not currently supported.
  fps.raw_error_stdev = raw_err_stdev;
  fps.is_flash = 0;
  fps.noise_var = 0.0;
  fps.cor_coeff = 1.0;
  fps.log_coded_error = 0.0;
  fps.log_intra_error = 0.0;

  if (stats->mv_count > 0) {
    fps.MVr = (double)stats->sum_mvr / stats->mv_count;
    fps.mvr_abs = (double)stats->sum_mvr_abs / stats->mv_count;
    fps.MVc = (double)stats->sum_mvc / stats->mv_count;
    fps.mvc_abs = (double)stats->sum_mvc_abs / stats->mv_count;
    fps.MVrv = ((double)stats->sum_mvrs -
                ((double)stats->sum_mvr * stats->sum_mvr / stats->mv_count)) /
               stats->mv_count;
    fps.MVcv = ((double)stats->sum_mvcs -
                ((double)stats->sum_mvc * stats->sum_mvc / stats->mv_count)) /
               stats->mv_count;
    fps.mv_in_out_count = (double)stats->sum_in_vectors / (stats->mv_count * 2);
    fps.new_mv_count = stats->new_mv_count;
    fps.pcnt_motion = (double)stats->mv_count / num_mbs;
  } else {
    fps.MVr = 0.0;
    fps.mvr_abs = 0.0;
    fps.MVc = 0.0;
    fps.mvc_abs = 0.0;
    fps.MVrv = 0.0;
    fps.MVcv = 0.0;
    fps.mv_in_out_count = 0.0;
    fps.new_mv_count = 0.0;
    fps.pcnt_motion = 0.0;
  }

  // TODO(paulwilkins):  Handle the case when duration is set to 0, or
  // something less than the full time between subsequent values of
  // cpi->source_time_stamp.
  fps.duration = (double)ts_duration;

  normalize_firstpass_stats(&fps, num_mbs_16X16, cm->width, cm->height);

  // We will store the stats inside the persistent twopass struct (and NOT the
  // local variable 'fps'), and then cpi->output_pkt_list will point to it.
  *this_frame_stats = fps;
  if (!cpi->ppi->lap_enabled) {
    output_stats(this_frame_stats, cpi->ppi->output_pkt_list);
  } else {
    av1_firstpass_info_push(&twopass->firstpass_info, this_frame_stats);
  }
  if (cpi->ppi->twopass.stats_buf_ctx->total_stats != NULL) {
    av1_accumulate_stats(cpi->ppi->twopass.stats_buf_ctx->total_stats, &fps);
  }
  twopass->stats_buf_ctx->stats_in_end++;
  // When ducky encode is on, we always use linear buffer for stats_buf_ctx.
  if (cpi->use_ducky_encode == 0) {
    // TODO(angiebird): Figure out why first pass uses circular buffer.
    /* In the case of two pass, first pass uses it as a circular buffer,
     * when LAP is enabled it is used as a linear buffer*/
    if ((cpi->oxcf.pass == AOM_RC_FIRST_PASS) &&
        (twopass->stats_buf_ctx->stats_in_end >=
         twopass->stats_buf_ctx->stats_in_buf_end)) {
      twopass->stats_buf_ctx->stats_in_end =
          twopass->stats_buf_ctx->stats_in_start;
    }
  }
}